

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_fread(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  sxu32 sVar1;
  io_private *pDev;
  jx9_value *pjVar2;
  jx9_user_func *pjVar3;
  char *pcVar4;
  jx9_int64 jVar5;
  sxi32 iErr;
  sxu32 nByte;
  jx9_vm *pVm;
  
  if ((((nArg < 1) || (((*apArg)->iFlags & 0x100) == 0)) ||
      (pDev = (io_private *)((*apArg)->x).pOther, pDev == (io_private *)0x0)) ||
     (pDev->iMagic != 0xfeac14)) {
    pjVar3 = pCtx->pFunc;
    pVm = pCtx->pVm;
    pcVar4 = "Expecting an IO handle";
    iErr = 2;
  }
  else {
    if (pDev->pStream == (jx9_io_stream *)0x0) {
      jx9_context_throw_error_format
                (pCtx,2,
                 "IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE"
                 ,(pCtx->pFunc->sName).zString,"null_stream");
      goto LAB_0013c96d;
    }
    nByte = 0x1000;
    if (nArg != 1) {
      pjVar2 = apArg[1];
      jx9MemObjToInteger(pjVar2);
      sVar1 = *(sxu32 *)&pjVar2->x;
      nByte = 0x1000;
      if (0 < (int)sVar1) {
        nByte = sVar1;
      }
    }
    pcVar4 = (char *)SyMemBackendAlloc(&pCtx->pVm->sAllocator,nByte);
    if (pcVar4 != (char *)0x0) {
      jVar5 = StreamRead(pDev,pcVar4,(long)(int)nByte);
      if (jVar5 < 1) {
        pjVar2 = pCtx->pRet;
        jx9MemObjRelease(pjVar2);
        (pjVar2->x).rVal = 0.0;
        pjVar2->iFlags = pjVar2->iFlags & 0xfffffe90U | 8;
      }
      else {
        jx9_value_string(pCtx->pRet,pcVar4,(int)jVar5);
      }
      jx9_context_free_chunk(pCtx,pcVar4);
      return 0;
    }
    pjVar3 = pCtx->pFunc;
    pVm = pCtx->pVm;
    pcVar4 = "JX9 is running out of memory";
    iErr = 1;
  }
  jx9VmThrowError(pVm,&pjVar3->sName,iErr,pcVar4);
LAB_0013c96d:
  pjVar2 = pCtx->pRet;
  jx9MemObjRelease(pjVar2);
  (pjVar2->x).rVal = 0.0;
  pjVar2->iFlags = pjVar2->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Builtin_fread(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const jx9_io_stream *pStream;
	io_private *pDev;
	jx9_int64 nRead;
	void *pBuf;
	int nLen;
	if( nArg < 1 || !jx9_value_is_resource(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract our private data */
	pDev = (io_private *)jx9_value_to_resource(apArg[0]);
	/* Make sure we are dealing with a valid io_private instance */
	if( IO_PRIVATE_INVALID(pDev) ){
		/*Expecting an IO handle */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the target IO stream device */
	pStream = pDev->pStream;
	if( pStream == 0  ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE", 
			jx9_function_name(pCtx), pStream ? pStream->zName : "null_stream"
			);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
        nLen = 4096;
	if( nArg > 1 ){
 	  nLen = jx9_value_to_int(apArg[1]);
	  if( nLen < 1 ){
		/* Invalid length, set a default length */
		nLen = 4096;
	  }
        }
	/* Allocate enough buffer */
	pBuf = jx9_context_alloc_chunk(pCtx, (unsigned int)nLen, FALSE, FALSE);
	if( pBuf == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "JX9 is running out of memory");			
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Perform the requested operation */
	nRead = StreamRead(pDev, pBuf, (jx9_int64)nLen);
	if( nRead < 1 ){
		/* Nothing read, return FALSE */
		jx9_result_bool(pCtx, 0);
	}else{
		/* Make a copy of the data just read */
		jx9_result_string(pCtx, (const char *)pBuf, (int)nRead);
	}
	/* Release the buffer */
	jx9_context_free_chunk(pCtx, pBuf);
	return JX9_OK;	
}